

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-split.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  bool bVar1;
  Fatal local_658;
  undefined1 local_4c0 [8];
  WasmSplitOptions options;
  char **argv_local;
  int argc_local;
  
  options.usedOptions.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)argv;
  wasm::WasmSplitOptions::WasmSplitOptions((WasmSplitOptions *)local_4c0);
  wasm::WasmSplitOptions::parse
            ((WasmSplitOptions *)local_4c0,argc,
             (char **)options.usedOptions.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  bVar1 = wasm::WasmSplitOptions::validate((WasmSplitOptions *)local_4c0);
  if (bVar1) {
    switch(options.super_ToolOptions.enabledFeatures.features) {
    case 0:
      anon_unknown.dwarf_41187::splitModule((WasmSplitOptions *)local_4c0);
      break;
    case 1:
      anon_unknown.dwarf_41187::multiSplitModule((WasmSplitOptions *)local_4c0);
      break;
    case 2:
      anon_unknown.dwarf_41187::instrumentModule((WasmSplitOptions *)local_4c0);
      break;
    case 3:
      anon_unknown.dwarf_41187::mergeProfiles((WasmSplitOptions *)local_4c0);
      break;
    case 4:
      anon_unknown.dwarf_41187::printReadableProfile((WasmSplitOptions *)local_4c0);
    }
    wasm::WasmSplitOptions::~WasmSplitOptions((WasmSplitOptions *)local_4c0);
    return 0;
  }
  wasm::Fatal::Fatal(&local_658);
  wasm::Fatal::operator<<(&local_658,(char (*) [31])"Invalid command line arguments");
  wasm::Fatal::~Fatal(&local_658);
}

Assistant:

int main(int argc, const char* argv[]) {
  WasmSplitOptions options;
  options.parse(argc, argv);

  if (!options.validate()) {
    Fatal() << "Invalid command line arguments";
  }

  switch (options.mode) {
    case WasmSplitOptions::Mode::Split:
      splitModule(options);
      break;
    case WasmSplitOptions::Mode::MultiSplit:
      multiSplitModule(options);
      break;
    case WasmSplitOptions::Mode::Instrument:
      instrumentModule(options);
      break;
    case WasmSplitOptions::Mode::MergeProfiles:
      mergeProfiles(options);
      break;
    case WasmSplitOptions::Mode::PrintProfile:
      printReadableProfile(options);
      break;
  }
}